

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_declare_value
          (irGenerator *this,string *name,SymbolKind kind,int id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *inits,localArrayInitType initType,
          int len)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *this_00;
  string name_00;
  string name_01;
  string name_02;
  __type_conflict _Var1;
  int iVar2;
  IntTy *pIVar3;
  mapped_type *this_01;
  PtrTy *pPVar4;
  mapped_type *pmVar5;
  uint extraout_var;
  uint extraout_var_00;
  uint extraout_var_01;
  uint32_t id_00;
  uint32_t id_01;
  uint32_t id_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  GlobalValue *this_03;
  long lVar6;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  undefined8 uStack_4b8;
  int local_4b0;
  undefined4 uStack_4ac;
  SharedTyPtr ty;
  Variable variable_1;
  GlobalValue globalValue;
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  string varName;
  RightVal size;
  RightVal value;
  undefined8 local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_360 [2];
  SharedTyPtr local_350;
  SharedTyPtr local_340;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_330;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2d0;
  SharedTyPtr local_2b8;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  __shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> local_180;
  Variable variable;
  string local_150;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_4b0 = id;
  _Var1 = std::operator==((this->_funcStack).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1,&this->_GlobalInitFuncName
                         );
  if (_Var1) {
    globalValue._8_4_ = 0;
    globalValue._40_1_ = 0;
    globalValue.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001db770;
    globalValue.len.super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int>._M_engaged = false;
    if (len == 0) {
      variable_1.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      variable_1.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001db770;
      arm::ConstValue::operator=(&globalValue,(ConstValue *)&variable_1);
      std::__detail::__variant::
      _Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&variable_1.ty);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d0,inits);
      arm::ConstValue::ConstValue
                ((ConstValue *)&variable_1,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2d0,
                 (optional<int>)0x0);
      arm::ConstValue::operator=(&globalValue,(ConstValue *)&variable_1);
      std::__detail::__variant::
      _Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&variable_1.ty);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2d0);
    }
    std::__cxx11::string::string(local_a0,(string *)name);
    name_00._M_string_length._0_4_ = local_4b0;
    name_00._M_dataplus._M_p = (pointer)uStack_4b8;
    name_00._M_string_length._4_4_ = uStack_4ac;
    name_00.field_2._M_allocated_capacity =
         (size_type)ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    name_00.field_2._8_8_ =
         ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    getVarName((string *)&variable_1,this,name_00,id_00);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
              ::operator[](&(this->_package).global_values,(key_type *)&variable_1);
    arm::ConstValue::operator=(this_01,&globalValue);
    std::__cxx11::string::~string((string *)&variable_1);
    std::__cxx11::string::~string(local_a0);
    std::__detail::__variant::
    _Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&globalValue.field_0x8);
    return;
  }
  varName._M_dataplus._M_p = (pointer)&varName.field_2;
  varName._M_string_length = 0;
  ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  varName.field_2._M_local_buf[0] = '\0';
  if (kind == Ptr) {
    pPVar4 = (PtrTy *)operator_new(0x18);
    pIVar3 = (IntTy *)operator_new(8);
    (pIVar3->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::IntTy,void>
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&local_350,pIVar3);
    mir::types::PtrTy::PtrTy(pPVar4,&local_350);
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::PtrTy,void>
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&globalValue,pPVar4);
    std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *)&globalValue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&globalValue.field_0x8);
    this_02 = &local_350.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_0016b5e3:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_02);
  }
  else {
    if (kind == Array) {
      if (initType - Small < 2) {
        std::__cxx11::string::string(local_c0,(string *)name);
        name_01._M_string_length._0_4_ = local_4b0;
        name_01._M_dataplus._M_p = (pointer)uStack_4b8;
        name_01._M_string_length._4_4_ = uStack_4ac;
        name_01.field_2._M_allocated_capacity =
             (size_type)ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        name_01.field_2._8_8_ =
             ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        getVarName((string *)&variable_1,this,name_01,id_01);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &globalValue,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &variable_1,"_$array");
        std::__cxx11::string::~string((string *)&variable_1);
        std::__cxx11::string::~string(local_c0);
        mir::types::new_int_ty();
        local_368 = value.
                    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u.
                    _0_8_;
        a_Stack_360[0]._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             value.
             super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._8_8_;
        value.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_ = 0;
        value.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._8_8_ = 0;
        mir::types::new_array_ty((SharedTyPtr *)&size,(int)&local_368);
        local_2b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             size.
             super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_;
        local_2b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             size.
             super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
             super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._8_8_;
        size.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_ = 0;
        size.
        super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
        super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._8_8_ = 0;
        mir::inst::Variable::Variable(&variable_1,&local_2b8,true,false,false);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_2b8.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&size.
                           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>
                           ._M_u + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_360);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&value.
                           super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
                           super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>
                           ._M_u + 8));
        std::__cxx11::string::string((string *)&local_150,(string *)&globalValue);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                 ::operator[](&this->_funcNameToFuncData,
                              (this->_funcStack).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1);
        insertLocalValue(this,&local_150,pmVar5->_nowLocalValueId,&variable_1);
        std::__cxx11::string::~string((string *)&local_150);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
                 ::operator[](&this->_funcNameToFuncData,
                              (this->_funcStack).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish + -1);
        pmVar5->_nowLocalValueId = pmVar5->_nowLocalValueId + 1;
        mir::inst::Variable::~Variable(&variable_1);
        std::__cxx11::string::~string((string *)&globalValue);
      }
      pPVar4 = (PtrTy *)operator_new(0x18);
      pIVar3 = (IntTy *)operator_new(8);
      (pIVar3->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
      std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mir::types::IntTy,void>
                ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&local_340,pIVar3);
      mir::types::PtrTy::PtrTy(pPVar4,&local_340);
      std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mir::types::PtrTy,void>
                ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&globalValue,pPVar4);
      std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *)&globalValue);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&globalValue.field_0x8);
      this_02 = &local_340.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      goto LAB_0016b5e3;
    }
    if (kind == INT) {
      pIVar3 = (IntTy *)operator_new(8);
      (pIVar3->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
      std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mir::types::IntTy,void>
                ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&globalValue,pIVar3);
      std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *)&globalValue);
      this_02 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&globalValue.field_0x8;
      goto LAB_0016b5e3;
    }
  }
  std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_180,&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>);
  mir::inst::Variable::Variable(&variable,(SharedTyPtr *)&local_180,false,false,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
  std::__cxx11::string::string(local_e0,(string *)name);
  name_02._M_string_length._0_4_ = local_4b0;
  name_02._M_dataplus._M_p = (pointer)uStack_4b8;
  name_02._M_string_length._4_4_ = uStack_4ac;
  name_02.field_2._M_allocated_capacity =
       (size_type)ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  name_02.field_2._8_8_ =
       ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  getVarName((string *)&globalValue,this,name_02,id_02);
  std::__cxx11::string::operator=((string *)&varName,(string *)&globalValue);
  std::__cxx11::string::~string((string *)&globalValue);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::string((string *)&local_1a0,(string *)&varName);
  this_00 = &this->_funcNameToFuncData;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  insertLocalValue(this,&local_1a0,pmVar5->_nowLocalValueId,&variable);
  std::__cxx11::string::~string((string *)&local_1a0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_00,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar5->_nowLocalValueId = pmVar5->_nowLocalValueId + 1;
  if (kind != Array) goto switchD_0016b6fc_default;
  switch(initType) {
  case Small:
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_108,&varName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalValue
                   ,&varName,"_$array");
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<int,std::__cxx11::string> *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalValue);
    ir_ref(this,(LeftVal *)&local_108,(LeftVal *)&local_58,true);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_58);
    std::__cxx11::string::~string((string *)&globalValue);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_108);
    goto switchD_0016b6fc_default;
  case SmallInit:
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_130,&varName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalValue
                   ,&varName,"_$array");
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<int,std::__cxx11::string> *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&globalValue);
    ir_ref(this,(LeftVal *)&local_130,(LeftVal *)&local_80,true);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_80);
    std::__cxx11::string::~string((string *)&globalValue);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_130);
    variable_1.super_Displayable._vptr_Displayable =
         (_func_int **)((ulong)variable_1.super_Displayable._vptr_Displayable._4_4_ << 0x20);
    size.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_ =
         size.
         super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_ &
         0xffffffff00000000;
    size.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
    iVar2 = (*((ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Displayable)._vptr_Displayable[3])();
    if ((extraout_var_01 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    globalValue.super_Displayable._vptr_Displayable._0_4_ = iVar2 * len;
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
              ((variant<int,int,std::__cxx11::string> *)&size,(int *)&globalValue);
    globalValue.super_Displayable._vptr_Displayable =
         globalValue.super_Displayable._vptr_Displayable & 0xffffffff00000000;
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
              ((variant<int,int,std::__cxx11::string> *)&variable_1,(int *)&globalValue);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"",(allocator<char> *)&value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"memset",(allocator<char> *)((long)&uStack_4b8 + 7));
    std::__detail::__variant::_Variant_storage<false,int,int,std::__cxx11::string>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,int,std::__cxx11::string> *)&globalValue,&varName);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&globalValue.field_0x28,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&variable_1);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base(&local_410,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&size);
    __l_02._M_len = 3;
    __l_02._M_array = (iterator)&globalValue;
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_2e8,__l_02,(allocator_type *)((long)&uStack_4b8 + 6));
    ir_function_call(this,&local_1c0,VID,&local_1e0,&local_2e8,true);
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_2e8);
    lVar6 = 0x50;
    do {
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&globalValue.super_Displayable._vptr_Displayable + lVar6));
      lVar6 = lVar6 + -0x28;
    } while (lVar6 != -0x28);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    break;
  case BigNoInit:
    globalValue.super_Displayable._vptr_Displayable =
         globalValue.super_Displayable._vptr_Displayable & 0xffffffff00000000;
    globalValue._32_1_ = 0;
    iVar2 = (*((ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Displayable)._vptr_Displayable[3])();
    if ((extraout_var & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    variable_1.super_Displayable._vptr_Displayable._0_4_ = iVar2 * len;
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
              ((variant<int,int,std::__cxx11::string> *)&globalValue,(int *)&variable_1);
    std::__cxx11::string::string((string *)&local_280,(string *)&varName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"malloc",(allocator<char> *)&size);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&variable_1,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&globalValue);
    __l._M_len = 1;
    __l._M_array = (iterator)&variable_1;
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_330,__l,(allocator_type *)&value);
    ir_function_call(this,&local_280,Ptr,&local_2a0,&local_330,true);
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_330);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&variable_1);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
             ::operator[](this_00,(this->_funcStack).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pmVar5->_freeList,&varName);
    this_03 = &globalValue;
    goto LAB_0016bcde;
  case BigInit:
    variable_1.super_Displayable._vptr_Displayable =
         variable_1.super_Displayable._vptr_Displayable & 0xffffffff00000000;
    size.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_ =
         size.
         super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_ &
         0xffffffff00000000;
    value.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_ =
         value.
         super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
         super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_u._0_8_ &
         0xffffffff00000000;
    size.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
    value.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = '\0';
    iVar2 = (*((ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Displayable)._vptr_Displayable[3])();
    if ((extraout_var_00 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    globalValue.super_Displayable._vptr_Displayable._0_4_ = iVar2 * len;
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
              ((variant<int,int,std::__cxx11::string> *)&size,(int *)&globalValue);
    std::__cxx11::string::string((string *)&local_200,(string *)&varName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"malloc",(allocator<char> *)((long)&uStack_4b8 + 7));
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&globalValue,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&size);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&globalValue;
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_300,__l_00,(allocator_type *)((long)&uStack_4b8 + 6));
    ir_function_call(this,&local_200,Ptr,&local_220,&local_300,true);
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_300);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&globalValue);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    globalValue.super_Displayable._vptr_Displayable =
         globalValue.super_Displayable._vptr_Displayable & 0xffffffff00000000;
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int>
              ((variant<int,int,std::__cxx11::string> *)&value,(int *)&globalValue);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"",(allocator<char> *)((long)&uStack_4b8 + 7));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"memset",(allocator<char> *)((long)&uStack_4b8 + 6));
    std::__detail::__variant::_Variant_storage<false,int,int,std::__cxx11::string>::
    _Variant_storage<2ul,std::__cxx11::string&>
              ((_Variant_storage<false,int,int,std::__cxx11::string> *)&globalValue,&varName);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&globalValue.field_0x28,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value);
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base(&local_410,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&size);
    __l_01._M_len = 3;
    __l_01._M_array = (iterator)&globalValue;
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_318,__l_01,(allocator_type *)((long)&uStack_4ac + 3));
    ir_function_call(this,&local_240,VID,&local_260,&local_318,true);
    std::
    vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_318);
    lVar6 = 0x50;
    do {
      std::__detail::__variant::
      _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&globalValue.super_Displayable._vptr_Displayable + lVar6));
      lVar6 = lVar6 + -0x28;
    } while (lVar6 != -0x28);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
             ::operator[](this_00,(this->_funcStack).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pmVar5->_freeList,&varName);
    std::__detail::__variant::
    _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&value);
    break;
  default:
    goto switchD_0016b6fc_default;
  }
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&size);
  this_03 = (GlobalValue *)&variable_1;
LAB_0016bcde:
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_03);
switchD_0016b6fc_default:
  mir::inst::Variable::~Variable(&variable);
  std::__cxx11::string::~string((string *)&varName);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void irGenerator::ir_declare_value(string name, symbol::SymbolKind kind, int id,
                                   std::vector<uint32_t> inits,
                                   localArrayInitType initType, int len) {
  if (_funcStack.back() == _GlobalInitFuncName) {
    GlobalValue globalValue;
    if (len == 0) {
      globalValue = GlobalValue(0);
    } else {
      globalValue = GlobalValue(inits);
    }
    _package.global_values[getVarName(name, id)] = globalValue;
  } else {
    SharedTyPtr ty;
    bool is_memory;
    string varName;

    switch (kind) {
      case front::symbol::SymbolKind::INT:
        ty = SharedTyPtr(new IntTy());
        is_memory = false;
        break;
      case front::symbol::SymbolKind::Array:
        if (initType == localArrayInitType::Small ||
            initType == localArrayInitType::SmallInit) {
          auto varNameRef = getVarName(name, id) + "_$array";

          Variable variable(
              mir::types::new_array_ty(mir::types::new_int_ty(), len), true,
              false, false);
          insertLocalValue(
              varNameRef,
              _funcNameToFuncData[_funcStack.back()]._nowLocalValueId,
              variable);
          _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++;
        }
        ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
        is_memory = false;
        break;
      case front::symbol::SymbolKind::Ptr:
        ty = SharedTyPtr(new PtrTy(SharedTyPtr(new IntTy())));
        is_memory = false;
        break;
      default:
        break;
    }
    Variable variable(ty, is_memory, false);
    varName = getVarName(name, id);

    insertLocalValue(varName,
                     _funcNameToFuncData[_funcStack.back()]._nowLocalValueId,
                     variable);
    _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++;

    if (kind == symbol::SymbolKind::Array) {
      switch (initType) {
        case localArrayInitType::Small: {
          ir_ref(varName, varName + "_$array", true);
          break;
        }
        case localArrayInitType::SmallInit: {
          ir_ref(varName, varName + "_$array", true);
          RightVal value;
          RightVal size;
          size.emplace<0>(len * ty->size().value());
          value.emplace<0>(0);
          ir_function_call("", symbol::SymbolKind::VID, "memset",
                           {varName, value, size}, true);
          break;
        }
        case localArrayInitType::BigInit: {
          RightVal nitems;
          RightVal size;
          RightVal value;

          size.emplace<0>(len * ty->size().value());
          ir_function_call(varName, symbol::SymbolKind::Ptr, "malloc", {size},
                           true);
          value.emplace<0>(0);
          ir_function_call("", symbol::SymbolKind::VID, "memset",
                           {varName, value, size}, true);
          _funcNameToFuncData[_funcStack.back()]._freeList.push_back(varName);
          break;
        }
        case localArrayInitType::BigNoInit: {
          RightVal right;
          right.emplace<0>(len * ty->size().value());
          ir_function_call(varName, symbol::SymbolKind::Ptr, "malloc", {right},
                           true);
          _funcNameToFuncData[_funcStack.back()]._freeList.push_back(varName);
          break;
        }
        default:
          break;
      }
    }
  }
}